

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_SetNullView_Test::TestBody
          (MicroStringPrevTest_SetNullView_Test *this)

{
  bool bVar1;
  Arena *pAVar2;
  char *pcVar3;
  time_t tVar4;
  AssertHelper local_158;
  Message local_150;
  size_t local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_5;
  Message local_128;
  size_t local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_4;
  Message local_100;
  string_view local_f8;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_3;
  size_t zero;
  Message local_b8;
  size_t local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Message local_90;
  size_t local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_58;
  string_view local_50;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  size_t local_20;
  size_t self_used;
  size_t used;
  MicroStringPrevTest_SetNullView_Test *this_local;
  
  used = (size_t)this;
  self_used = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  local_20 = MicroString::SpaceUsedExcludingSelfLong(&(this->super_MicroStringPrevTest).str_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_);
  pAVar2 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  MicroString::Set(&(this->super_MicroStringPrevTest).str_,stack0xffffffffffffffd0,pAVar2);
  local_50 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_40,"str_.Get()","\"\"",&local_50,
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x184,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_88 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_80,"used","arena_space_used()",&self_used,&local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x185,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0 = MicroString::SpaceUsedExcludingSelfLong(&(this->super_MicroStringPrevTest).str_);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_a8,"self_used","str_.SpaceUsedExcludingSelfLong()",&local_20,
             &local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&zero,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x186,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&zero,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  tVar4 = time((time_t *)0x0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_3.message_,(char *)0x0,
             (ulong)(tVar4 == 0));
  pAVar2 = MicroStringPrevTest::arena(&this->super_MicroStringPrevTest);
  MicroString::Set(&(this->super_MicroStringPrevTest).str_,stack0xffffffffffffff28,pAVar2);
  local_f8 = MicroString::Get(&(this->super_MicroStringPrevTest).str_);
  testing::internal::EqHelper::
  Compare<std::basic_string_view<char,_std::char_traits<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_e8,"str_.Get()","\"\"",&local_f8,
             (char (*) [1])(anon_var_dwarf_37cdd0 + 5));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_120 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_118,"used","arena_space_used()",&self_used,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_148 = MicroString::SpaceUsedExcludingSelfLong(&(this->super_MicroStringPrevTest).str_);
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)local_140,"self_used","str_.SpaceUsedExcludingSelfLong()",&local_20,
             &local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetNullView) {
  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  str_.Set(absl::string_view(), arena());
  EXPECT_EQ(str_.Get(), "");
  EXPECT_EQ(used, arena_space_used());
  EXPECT_GE(self_used, str_.SpaceUsedExcludingSelfLong());

  // Again but with a non-constant size to avoid the CONSTANT_P path.
  size_t zero = time(nullptr) == 0;
  str_.Set(absl::string_view(nullptr, zero), arena());
  EXPECT_EQ(str_.Get(), "");
  EXPECT_EQ(used, arena_space_used());
  EXPECT_GE(self_used, str_.SpaceUsedExcludingSelfLong());
}